

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::handleExtremes(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *lp)

{
  SPxOut *pSVar1;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  type_conflict5 tVar3;
  bool bVar4;
  int iVar5;
  Verbosity VVar6;
  ulong *puVar7;
  int *piVar8;
  element_type *this_00;
  int __c;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Verbosity old_verbosity_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  obj;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  int row_j;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *row;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  int i_1;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *col;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  absBnd;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  up;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lo;
  int j;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhs;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lhs;
  int i;
  int objCnt;
  int chgLRhs;
  int chgBnds;
  int remNzos;
  int remRows;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  tol;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxVal;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffd448;
  uint in_stack_ffffffffffffd450;
  uint in_stack_ffffffffffffd454;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffd458;
  uint in_stack_ffffffffffffd460;
  uint in_stack_ffffffffffffd464;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffd468;
  bool local_2b89;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffd488;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffd498;
  int in_stack_ffffffffffffd4a4;
  uint uVar9;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffd4a8;
  FreeConstraintPS *in_stack_ffffffffffffd4b0;
  type_conflict5 local_2b39;
  type_conflict5 local_2b29;
  bool local_2b19;
  type_conflict5 local_2b09;
  type_conflict5 local_2af9;
  bool local_2ae5;
  undefined1 *in_stack_ffffffffffffd540;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffd548;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffd550;
  type_conflict5 local_2aa1;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffd560;
  uint in_stack_ffffffffffffd568;
  uint in_stack_ffffffffffffd56c;
  type_conflict5 local_2a81;
  bool local_2a71;
  type_conflict5 local_2a61;
  type_conflict5 local_2a51;
  bool local_2a41;
  undefined4 local_2a38;
  Verbosity local_2a34;
  undefined1 local_2a30 [128];
  undefined1 local_29b0 [128];
  ulong local_2930;
  undefined1 local_2928 [128];
  undefined1 local_28a8 [128];
  ulong local_2828;
  undefined1 local_2820 [128];
  undefined8 local_27a0;
  undefined1 local_2798 [256];
  undefined1 local_2698 [128];
  undefined8 local_2618;
  undefined1 local_260c [128];
  undefined1 local_258c [128];
  undefined4 local_250c;
  Verbosity local_2508;
  undefined1 local_2504 [128];
  undefined1 local_2484 [128];
  undefined1 local_2404 [128];
  undefined4 local_2384;
  Verbosity local_2380;
  uint local_237c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2378;
  undefined1 local_236c [128];
  undefined1 local_22ec [128];
  undefined1 local_226c [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_21ec;
  uint local_216c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2168;
  undefined8 local_2160;
  undefined8 local_2158;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2150;
  undefined1 local_20d0 [128];
  undefined1 local_2050 [128];
  undefined1 local_1fd0 [128];
  undefined1 local_1f50 [144];
  undefined1 local_1ec0 [128];
  undefined1 local_1e40 [128];
  undefined1 local_1dc0 [128];
  undefined1 local_1d40 [128];
  ulong local_1cc0;
  undefined1 local_1cb8 [128];
  undefined1 local_1c38 [128];
  ulong local_1bb8;
  undefined1 local_1bb0 [128];
  undefined8 local_1b30;
  undefined1 local_1b28 [256];
  undefined1 local_1a28 [128];
  undefined8 local_19a8;
  undefined1 local_19a0 [128];
  undefined1 local_1920 [128];
  undefined1 local_18a0 [128];
  ulong local_1820;
  undefined1 local_1818 [128];
  undefined1 local_1798 [128];
  ulong local_1718;
  undefined1 local_1710 [128];
  undefined8 local_1690;
  undefined1 local_1688 [256];
  undefined1 local_1588 [128];
  undefined8 local_1508;
  undefined1 local_14fc [128];
  uint local_147c;
  undefined1 local_1475;
  undefined1 local_1468 [32];
  undefined1 local_1448 [128];
  ulong local_13c8;
  undefined1 local_13c0 [128];
  undefined1 local_1340 [128];
  undefined1 local_12c0 [128];
  ulong local_1240;
  undefined1 local_1238 [128];
  undefined1 local_11b8 [128];
  ulong local_1138;
  undefined1 local_1130 [128];
  undefined8 local_10b0;
  undefined1 local_10a8 [256];
  undefined1 local_fa8 [128];
  undefined8 local_f28;
  undefined1 local_f20 [128];
  undefined1 local_ea0 [128];
  undefined1 local_e20 [128];
  ulong local_da0;
  undefined1 local_d98 [128];
  undefined1 local_d18 [128];
  ulong local_c98;
  undefined1 local_c90 [128];
  undefined8 local_c10;
  undefined1 local_c08 [256];
  undefined1 local_b08 [128];
  undefined8 local_a88;
  undefined1 local_a80 [128];
  uint local_a00;
  int local_9fc;
  int local_9f8;
  int local_9f4;
  int local_9f0;
  int local_9ec;
  undefined1 local_968 [128];
  undefined8 local_8e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8e0;
  undefined1 local_860 [128];
  undefined8 local_7e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_758;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_6d8;
  undefined8 local_6c8;
  undefined8 local_6c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6b8;
  undefined8 local_6b0;
  undefined8 *local_6a8;
  undefined1 *local_6a0;
  undefined8 local_698;
  ulong *local_690;
  undefined1 *local_688;
  undefined8 local_680;
  ulong *local_678;
  undefined1 *local_670;
  undefined8 local_668;
  undefined8 local_660;
  undefined1 *local_658;
  undefined8 local_650;
  undefined8 local_648;
  undefined1 *local_640;
  undefined8 local_638;
  undefined8 *local_630;
  undefined1 *local_628;
  undefined8 local_620;
  ulong *local_618;
  undefined1 *local_610;
  undefined8 local_608;
  ulong *local_600;
  undefined1 *local_5f8;
  undefined8 local_5f0;
  undefined8 local_5e8;
  undefined1 *local_5e0;
  undefined8 local_5d8;
  undefined8 local_5d0;
  undefined1 *local_5c8;
  undefined8 local_5c0;
  ulong *local_5b8;
  undefined1 *local_5b0;
  undefined8 local_5a8;
  undefined8 local_5a0;
  undefined1 *local_598;
  undefined8 local_590;
  undefined8 *local_588;
  undefined1 *local_580;
  undefined8 local_578;
  ulong *local_570;
  undefined1 *local_568;
  undefined8 local_560;
  ulong *local_558;
  undefined1 *local_550;
  undefined8 local_548;
  undefined8 local_540;
  undefined1 *local_538;
  undefined8 local_530;
  undefined8 local_528;
  undefined1 *local_520;
  undefined8 local_518;
  undefined8 *local_510;
  undefined1 *local_508;
  undefined8 local_500;
  ulong *local_4f8;
  undefined1 *local_4f0;
  undefined8 local_4e8;
  ulong *local_4e0;
  undefined1 *local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined1 *local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined1 *local_4a8;
  undefined8 local_4a0;
  undefined8 *local_498;
  undefined1 *local_490;
  undefined8 local_488;
  ulong *local_480;
  undefined1 *local_478;
  undefined8 local_470;
  ulong *local_468;
  undefined1 *local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined1 *local_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_328;
  undefined1 *local_320;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  ulong *local_298;
  ulong *local_290;
  undefined8 *local_288;
  undefined8 local_280;
  undefined8 local_278;
  ulong *local_270;
  ulong *local_268;
  undefined8 *local_260;
  undefined8 local_258;
  undefined8 local_250;
  ulong *local_248;
  ulong *local_240;
  undefined8 *local_238;
  undefined8 local_230;
  ulong *local_228;
  undefined8 local_220;
  undefined8 local_218;
  ulong *local_210;
  ulong *local_208;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  ulong *local_1e8;
  ulong *local_1e0;
  undefined8 *local_1d8;
  undefined8 local_1d0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1c1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  undefined1 *local_190;
  undefined8 *local_188;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  undefined8 *local_178;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_169;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  undefined1 *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_139;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  undefined1 *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_109;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_d9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  undefined8 *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined8 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  undefined8 *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_6d8 = in_RSI;
  local_6c0 = infinity();
  local_6b8 = &local_7d8;
  local_6c8 = 0;
  local_1d0 = local_6c0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
             (double)in_stack_ffffffffffffd458,
             (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
  local_7e0 = 0x4014000000000000;
  local_68 = &local_758;
  local_70 = &local_7d8;
  local_78 = &local_7e0;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_79,local_70);
  local_60 = &local_758;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
  local_50 = &local_758;
  local_58 = local_70;
  local_48 = local_78;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
             (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448,(double *)0x6f918d);
  feastol(in_stack_ffffffffffffd488);
  local_8e8 = 0x3f847ae147ae147b;
  local_28 = local_860;
  local_30 = &local_8e0;
  local_38 = &local_8e8;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,local_30);
  local_20 = local_860;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
  local_10 = local_860;
  local_18 = local_30;
  local_8 = local_38;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
             (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448,(double *)0x6f9262);
  epsZero(in_stack_ffffffffffffd488);
  tVar3 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffd448,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x6f928c);
  if (tVar3) {
    epsZero(in_stack_ffffffffffffd488);
  }
  else {
    local_420 = local_968;
    local_428 = local_860;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
               (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
  }
  local_2b0 = local_860;
  local_2b8 = local_968;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
             (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
  local_9ec = 0;
  local_9f0 = 0;
  local_9f4 = 0;
  local_9f8 = 0;
  local_9fc = 0;
  local_a00 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x6f9357);
  while (local_a00 = local_a00 - 1, -1 < (int)local_a00) {
    local_418 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                      (int)((ulong)in_stack_ffffffffffffd448 >> 0x20));
    local_410 = local_a80;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
               (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
    local_a88 = 0;
    tVar3 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffd448,(double *)0x6f93d1);
    local_2a41 = false;
    if (tVar3) {
      local_400 = local_b08;
      local_408 = local_a80;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
      epsZero(in_stack_ffffffffffffd488);
      local_2a41 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (in_stack_ffffffffffffd550,in_stack_ffffffffffffd548);
    }
    pSVar2 = local_6d8;
    uVar9 = local_a00;
    if (local_2a41 == false) {
      puVar7 = (ulong *)infinity();
      local_c98 = *puVar7 ^ 0x8000000000000000;
      local_688 = local_c90;
      local_690 = &local_c98;
      local_698 = 0;
      local_1e0 = local_690;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                 (double)in_stack_ffffffffffffd458,
                 (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffd448,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6f95ab);
      local_2a51 = false;
      if (tVar3) {
        local_a0 = local_d18;
        local_a8 = &local_758;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_a9,local_a8);
        local_90 = local_d18;
        local_98 = local_a8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
        local_88 = local_d18;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
        local_2a51 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)in_stack_ffffffffffffd448,
                                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)0x6f965c);
      }
      pSVar2 = local_6d8;
      uVar9 = local_a00;
      if (local_2a51 == false) {
        local_660 = infinity();
        local_658 = local_e20;
        local_668 = 0;
        local_1f0 = local_660;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                   (double)in_stack_ffffffffffffd458,
                   (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffd448,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x6f97b6);
        local_2a61 = false;
        if (tVar3) {
          local_2a61 = boost::multiprecision::operator>
                                 ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)in_stack_ffffffffffffd448,
                                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)0x6f97dd);
        }
        pSVar2 = local_6d8;
        uVar9 = local_a00;
        if (local_2a61 != false) {
          local_648 = infinity();
          local_640 = local_ea0;
          local_650 = 0;
          local_1f8 = local_648;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                     (double)in_stack_ffffffffffffd458,
                     (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
          (*(((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&(pSVar2->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SPxSimplifier)->
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            )._vptr_ClassArray[0x33])(pSVar2,(ulong)uVar9,local_ea0,0);
          local_9f8 = local_9f8 + 1;
        }
      }
      else {
        puVar7 = (ulong *)infinity();
        local_da0 = *puVar7 ^ 0x8000000000000000;
        local_670 = local_d98;
        local_678 = &local_da0;
        local_680 = 0;
        local_1e8 = local_678;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                   (double)in_stack_ffffffffffffd458,
                   (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
        (*(((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)&(pSVar2->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SPxSimplifier)->
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          )._vptr_ClassArray[0x33])(pSVar2,(ulong)uVar9,local_d98,0);
        local_9f8 = local_9f8 + 1;
      }
    }
    else {
      local_c10 = 0;
      local_6a0 = local_c08;
      local_6a8 = &local_c10;
      local_6b0 = 0;
      local_1d8 = local_6a8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                 (double)in_stack_ffffffffffffd458,
                 (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
      (*(((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)&(pSVar2->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._vptr_SPxSimplifier)->
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        )._vptr_ClassArray[0x33])(pSVar2,(ulong)uVar9,local_c08,0);
      local_9f8 = local_9f8 + 1;
    }
    local_3f8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                      (int)((ulong)in_stack_ffffffffffffd448 >> 0x20));
    local_3f0 = local_f20;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
               (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
    local_f28 = 0;
    tVar3 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffd448,(double *)0x6f9901);
    local_2a71 = false;
    if (tVar3) {
      local_3e0 = local_fa8;
      local_3e8 = local_f20;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
      epsZero(in_stack_ffffffffffffd488);
      local_2a71 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (in_stack_ffffffffffffd550,in_stack_ffffffffffffd548);
    }
    pSVar2 = local_6d8;
    uVar9 = local_a00;
    if (local_2a71 == false) {
      puVar7 = (ulong *)infinity();
      local_1138 = *puVar7 ^ 0x8000000000000000;
      local_610 = local_1130;
      local_618 = &local_1138;
      local_620 = 0;
      local_208 = local_618;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                 (double)in_stack_ffffffffffffd458,
                 (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffd448,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6f9adb);
      local_2a81 = false;
      if (tVar3) {
        local_d0 = local_11b8;
        local_d8 = &local_758;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_d9,local_d8);
        local_c0 = local_11b8;
        local_c8 = local_d8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
        local_b8 = local_11b8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
        local_2a81 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)in_stack_ffffffffffffd448,
                                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)0x6f9b8c);
      }
      pSVar2 = local_6d8;
      uVar9 = local_a00;
      if (local_2a81 == false) {
        local_5e8 = infinity();
        local_5e0 = local_12c0;
        local_5f0 = 0;
        local_218 = local_5e8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                   (double)in_stack_ffffffffffffd458,
                   (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffd448,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x6f9ce6);
        in_stack_ffffffffffffd56c = in_stack_ffffffffffffd56c & 0xffffff;
        if (tVar3) {
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffd448,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x6f9d0d);
          in_stack_ffffffffffffd56c = CONCAT13(tVar3,(int3)in_stack_ffffffffffffd56c);
        }
        if ((char)(in_stack_ffffffffffffd56c >> 0x18) != '\0') {
          in_stack_ffffffffffffd560 = local_6d8;
          in_stack_ffffffffffffd568 = local_a00;
          local_5d0 = infinity();
          local_5c8 = local_1340;
          local_5d8 = 0;
          local_220 = local_5d0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                     (double)in_stack_ffffffffffffd458,
                     (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
          (*(((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&(in_stack_ffffffffffffd560->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SPxSimplifier)->
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            )._vptr_ClassArray[0x36])
                    (in_stack_ffffffffffffd560,(ulong)in_stack_ffffffffffffd568,local_1340,0);
          local_9f8 = local_9f8 + 1;
        }
      }
      else {
        puVar7 = (ulong *)infinity();
        local_1240 = *puVar7 ^ 0x8000000000000000;
        local_5f8 = local_1238;
        local_600 = &local_1240;
        local_608 = 0;
        local_210 = local_600;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                   (double)in_stack_ffffffffffffd458,
                   (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
        (*(((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)&(pSVar2->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SPxSimplifier)->
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          )._vptr_ClassArray[0x36])(pSVar2,(ulong)uVar9,local_1238,0);
        local_9f8 = local_9f8 + 1;
      }
    }
    else {
      local_10b0 = 0;
      local_628 = local_10a8;
      local_630 = &local_10b0;
      local_638 = 0;
      local_200 = local_630;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                 (double)in_stack_ffffffffffffd458,
                 (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
      (*(((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)&(pSVar2->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._vptr_SPxSimplifier)->
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        )._vptr_ClassArray[0x36])(pSVar2,(ulong)uVar9,local_10a8,0);
      local_9f8 = local_9f8 + 1;
    }
    in_stack_ffffffffffffd550 =
         SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ::lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
               (int)((ulong)in_stack_ffffffffffffd448 >> 0x20));
    puVar7 = (ulong *)infinity();
    local_13c8 = *puVar7 ^ 0x8000000000000000;
    local_5b0 = local_13c0;
    local_5b8 = &local_13c8;
    local_5c0 = 0;
    local_228 = local_5b8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
               (double)in_stack_ffffffffffffd458,
               (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
    tVar3 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffd448,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x6f9e82);
    local_2aa1 = false;
    if (tVar3) {
      in_stack_ffffffffffffd548 =
           SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                 (int)((ulong)in_stack_ffffffffffffd448 >> 0x20));
      local_5a0 = infinity();
      local_598 = local_1448;
      local_5a8 = 0;
      local_230 = local_5a0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                 (double)in_stack_ffffffffffffd458,
                 (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
      local_2aa1 = boost::multiprecision::operator>=
                             ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)in_stack_ffffffffffffd448,
                              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)0x6f9f1e);
    }
    if (local_2aa1 != false) {
      operator_new(0xd0);
      local_1475 = 1;
      in_stack_ffffffffffffd540 = local_1468;
      std::shared_ptr<soplex::Tolerances>::shared_ptr
                ((shared_ptr<soplex::Tolerances> *)
                 CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                 (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffd448);
      FreeConstraintPS::FreeConstraintPS
                (in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8,in_stack_ffffffffffffd4a4,
                 in_stack_ffffffffffffd498);
      local_1475 = 0;
      std::
      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
      ::
      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FreeConstraintPS,void>
                ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                  *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                 (FreeConstraintPS *)in_stack_ffffffffffffd448);
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x6f9feb);
      Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
      ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
               (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                *)in_stack_ffffffffffffd448);
      removeRow((SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_ffffffffffffd458,in_stack_ffffffffffffd454);
      local_9ec = local_9ec + 1;
      piVar8 = DataArray<int>::operator[](&in_RDI->m_stat,1);
      *piVar8 = *piVar8 + 1;
      std::
      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
      ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                     *)0x6fa065);
    }
  }
  for (local_147c = 0; uVar9 = local_147c,
      iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x6fa10f), (int)uVar9 < iVar5; local_147c = local_147c + 1) {
    local_3d8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                        (int)((ulong)in_stack_ffffffffffffd448 >> 0x20));
    local_3d0 = local_14fc;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
               (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
    local_1508 = 0;
    tVar3 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffd448,(double *)0x6fa182);
    local_2ae5 = false;
    if (tVar3) {
      local_3c0 = local_1588;
      local_3c8 = local_14fc;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
      epsZero(in_stack_ffffffffffffd488);
      local_2ae5 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (in_stack_ffffffffffffd550,in_stack_ffffffffffffd548);
    }
    pSVar2 = local_6d8;
    uVar9 = local_147c;
    if (local_2ae5 == false) {
      puVar7 = (ulong *)infinity();
      local_1718 = *puVar7 ^ 0x8000000000000000;
      local_568 = local_1710;
      local_570 = &local_1718;
      local_578 = 0;
      local_240 = local_570;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                 (double)in_stack_ffffffffffffd458,
                 (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffd448,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6fa35c);
      local_2af9 = false;
      if (tVar3) {
        local_100 = local_1798;
        local_108 = &local_758;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_109,local_108);
        local_f0 = local_1798;
        local_f8 = local_108;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
        local_e8 = local_1798;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
        local_2af9 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)in_stack_ffffffffffffd448,
                                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)0x6fa40d);
      }
      pSVar2 = local_6d8;
      uVar9 = local_147c;
      if (local_2af9 == false) {
        local_540 = infinity();
        local_538 = local_18a0;
        local_548 = 0;
        local_250 = local_540;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                   (double)in_stack_ffffffffffffd458,
                   (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffd448,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x6fa567);
        local_2b09 = false;
        if (tVar3) {
          local_2b09 = boost::multiprecision::operator>
                                 ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)in_stack_ffffffffffffd448,
                                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)0x6fa58e);
        }
        pSVar2 = local_6d8;
        uVar9 = local_147c;
        if (local_2b09 != false) {
          local_528 = infinity();
          local_520 = local_1920;
          local_530 = 0;
          local_258 = local_528;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                     (double)in_stack_ffffffffffffd458,
                     (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
          (*(((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&(pSVar2->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SPxSimplifier)->
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            )._vptr_ClassArray[0x2a])(pSVar2,(ulong)uVar9,local_1920,0);
          local_9f4 = local_9f4 + 1;
        }
      }
      else {
        puVar7 = (ulong *)infinity();
        local_1820 = *puVar7 ^ 0x8000000000000000;
        local_550 = local_1818;
        local_558 = &local_1820;
        local_560 = 0;
        local_248 = local_558;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                   (double)in_stack_ffffffffffffd458,
                   (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
        (*(((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)&(pSVar2->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SPxSimplifier)->
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          )._vptr_ClassArray[0x2a])(pSVar2,(ulong)uVar9,local_1818,0);
        local_9f4 = local_9f4 + 1;
      }
    }
    else {
      local_1690 = 0;
      local_580 = local_1688;
      local_588 = &local_1690;
      local_590 = 0;
      local_238 = local_588;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                 (double)in_stack_ffffffffffffd458,
                 (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
      (*(((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)&(pSVar2->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._vptr_SPxSimplifier)->
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        )._vptr_ClassArray[0x2a])(pSVar2,(ulong)uVar9,local_1688,0);
      local_9f4 = local_9f4 + 1;
    }
    local_3b8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                        (int)((ulong)in_stack_ffffffffffffd448 >> 0x20));
    local_3b0 = local_19a0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
               (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
    local_19a8 = 0;
    tVar3 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffd448,(double *)0x6fa6b2);
    local_2b19 = false;
    if (tVar3) {
      local_3a0 = local_1a28;
      local_3a8 = local_19a0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
      epsZero(in_stack_ffffffffffffd488);
      local_2b19 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (in_stack_ffffffffffffd550,in_stack_ffffffffffffd548);
    }
    pSVar2 = local_6d8;
    uVar9 = local_147c;
    if (local_2b19 == false) {
      puVar7 = (ulong *)infinity();
      local_1bb8 = *puVar7 ^ 0x8000000000000000;
      local_4f0 = local_1bb0;
      local_4f8 = &local_1bb8;
      local_500 = 0;
      local_268 = local_4f8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                 (double)in_stack_ffffffffffffd458,
                 (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffd448,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6fa88c);
      local_2b29 = false;
      if (tVar3) {
        local_130 = local_1c38;
        local_138 = &local_758;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_139,local_138);
        local_120 = local_1c38;
        local_128 = local_138;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
        local_118 = local_1c38;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
        local_2b29 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)in_stack_ffffffffffffd448,
                                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)0x6fa93d);
      }
      pSVar2 = local_6d8;
      uVar9 = local_147c;
      if (local_2b29 == false) {
        local_4c8 = infinity();
        local_4c0 = local_1d40;
        local_4d0 = 0;
        local_278 = local_4c8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                   (double)in_stack_ffffffffffffd458,
                   (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffd448,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x6faa97);
        local_2b39 = false;
        if (tVar3) {
          local_2b39 = boost::multiprecision::operator>
                                 ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)in_stack_ffffffffffffd448,
                                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)0x6faabb);
        }
        pSVar2 = local_6d8;
        uVar9 = local_147c;
        if (local_2b39 != false) {
          local_4b0 = infinity();
          local_4a8 = local_1dc0;
          local_4b8 = 0;
          local_280 = local_4b0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                     (double)in_stack_ffffffffffffd458,
                     (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
          (*(((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&(pSVar2->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SPxSimplifier)->
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            )._vptr_ClassArray[0x2d])(pSVar2,(ulong)uVar9,local_1dc0,0);
          local_9f4 = local_9f4 + 1;
        }
      }
      else {
        puVar7 = (ulong *)infinity();
        local_1cc0 = *puVar7 ^ 0x8000000000000000;
        local_4d8 = local_1cb8;
        local_4e0 = &local_1cc0;
        local_4e8 = 0;
        local_270 = local_4e0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                   (double)in_stack_ffffffffffffd458,
                   (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
        (*(((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)&(pSVar2->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SPxSimplifier)->
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          )._vptr_ClassArray[0x2d])(pSVar2,(ulong)uVar9,local_1cb8,0);
        local_9f4 = local_9f4 + 1;
      }
    }
    else {
      local_1b30 = 0;
      local_508 = local_1b28;
      local_510 = &local_1b30;
      local_518 = 0;
      local_260 = local_510;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                 (double)in_stack_ffffffffffffd458,
                 (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
      (*(((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)&(pSVar2->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._vptr_SPxSimplifier)->
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        )._vptr_ClassArray[0x2d])(pSVar2,(ulong)uVar9,local_1b28,0);
      local_9f4 = local_9f4 + 1;
    }
    local_390 = local_1e40;
    local_398 = local_14fc;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
               (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
    local_380 = local_1ec0;
    local_388 = local_19a0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
               (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
    SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(&in_stack_ffffffffffffd448->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                );
    this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x6fabf9);
    Tolerances::epsilon(this_00);
    bVar4 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (in_stack_ffffffffffffd550,in_stack_ffffffffffffd548,
                       (double)in_stack_ffffffffffffd540);
    uVar9 = (uint)bVar4 << 0x18;
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x6fac37);
    if ((uVar9 & 0x1000000) != 0) {
      local_370 = local_1fd0;
      local_378 = local_14fc;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_ffffffffffffd448);
      local_2c0 = local_14fc;
      local_2c8 = local_1f50;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
      local_360 = local_20d0;
      local_368 = local_19a0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_ffffffffffffd448);
      local_2d0 = local_19a0;
      local_2d8 = local_2050;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffd448,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6fad57);
      if (tVar3) {
        local_358 = local_14fc;
      }
      else {
        local_358 = local_19a0;
      }
      local_350 = &local_2150;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
      local_2158 = 0x3ff0000000000000;
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffd448,(double *)0x6fadd3);
      if (tVar3) {
        local_2160 = 0x3ff0000000000000;
        local_180 = &local_2150;
        local_188 = &local_2160;
        local_178 = local_188;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd56c,in_stack_ffffffffffffd568),
                   (double)in_stack_ffffffffffffd560);
      }
      local_2168 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::colVector_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                                 (int)((ulong)in_stack_ffffffffffffd448 >> 0x20));
      local_216c = 0;
      while (uVar9 = local_216c,
            iVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(local_2168), (int)uVar9 < iVar5) {
        local_348 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::value(local_2168,local_216c);
        local_340 = local_226c;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
        spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)in_stack_ffffffffffffd448);
        local_1b0 = local_22ec;
        local_1b8 = &local_21ec;
        local_1c0 = &local_2150;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_1c1,local_1b8,local_1c0);
        local_1a8 = local_22ec;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
        local_190 = local_22ec;
        local_198 = local_1b8;
        local_1a0 = local_1c0;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448,
                   (cpp_dec_float<200U,_int,_void> *)0x6fafb8);
        local_330 = local_236c;
        local_338 = local_860;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
        bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (in_stack_ffffffffffffd550,in_stack_ffffffffffffd548);
        if (bVar4) {
          in_stack_ffffffffffffd488 = local_6d8;
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index(local_2168,(char *)(ulong)local_216c,__c);
          local_2378 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::rowVector_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450
                                                ),(int)((ulong)in_stack_ffffffffffffd448 >> 0x20));
          local_237c = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffd458,in_stack_ffffffffffffd454);
          if (-1 < (int)local_237c) {
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::remove(local_2378,(char *)(ulong)local_237c);
          }
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::remove(local_2168,(char *)(ulong)local_216c);
          SPxOut::
          debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[38],_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                    (in_RDI,(char (*) [38])"IMAISM04 aij={}  removed, absBnd={} \n",&local_21ec,
                     &local_2150);
          local_9f0 = local_9f0 + 1;
        }
        else {
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffd448,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x6fb0dc);
          if (tVar3) {
            if (((in_RDI->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).spxout != (SPxOut *)0x0) &&
               (VVar6 = SPxOut::getVerbosity
                                  ((in_RDI->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).spxout), 0 < (int)VVar6)) {
              local_2380 = SPxOut::getVerbosity
                                     ((in_RDI->
                                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).spxout);
              pSVar1 = (in_RDI->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).spxout;
              local_2384 = 1;
              (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_2384);
              soplex::operator<<((SPxOut *)
                                 CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                                 (char *)in_stack_ffffffffffffd448);
              local_320 = local_2404;
              local_328 = &local_21ec;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                         (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
              soplex::operator<<((SPxOut *)
                                 CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_ffffffffffffd448);
              soplex::operator<<((SPxOut *)
                                 CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                                 (_func_ostream_ptr_ostream_ptr *)in_stack_ffffffffffffd448);
              pSVar1 = (in_RDI->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).spxout;
              (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_2380);
            }
          }
          else {
            local_310 = local_2484;
            local_318 = &local_21ec;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                       (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
            local_300 = local_2504;
            local_308 = local_860;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                       (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
            bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (in_stack_ffffffffffffd550,in_stack_ffffffffffffd548);
            if (((bVar4) &&
                ((in_RDI->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).spxout != (SPxOut *)0x0)) &&
               (VVar6 = SPxOut::getVerbosity
                                  ((in_RDI->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).spxout), 0 < (int)VVar6)) {
              local_2508 = SPxOut::getVerbosity
                                     ((in_RDI->
                                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).spxout);
              pSVar1 = (in_RDI->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).spxout;
              local_250c = 1;
              (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_250c);
              soplex::operator<<((SPxOut *)
                                 CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                                 (char *)in_stack_ffffffffffffd448);
              local_2f0 = local_258c;
              local_2f8 = &local_21ec;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                         (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
              soplex::operator<<((SPxOut *)
                                 CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_ffffffffffffd448);
              soplex::operator<<((SPxOut *)
                                 CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                                 (_func_ostream_ptr_ostream_ptr *)in_stack_ffffffffffffd448);
              pSVar1 = (in_RDI->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).spxout;
              (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_2508);
            }
          }
          local_216c = local_216c + 1;
        }
      }
    }
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)in_stack_ffffffffffffd468,in_stack_ffffffffffffd464);
    local_2618 = 0;
    tVar3 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffd448,(double *)0x6fb3f1);
    local_2b89 = false;
    if (tVar3) {
      local_2e0 = local_2698;
      local_2e8 = local_260c;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
      epsZero(in_stack_ffffffffffffd488);
      local_2b89 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (in_stack_ffffffffffffd550,in_stack_ffffffffffffd548);
    }
    uVar9 = local_147c;
    if (local_2b89 == false) {
      puVar7 = (ulong *)infinity();
      local_2828 = *puVar7 ^ 0x8000000000000000;
      local_478 = local_2820;
      local_480 = &local_2828;
      local_488 = 0;
      local_290 = local_480;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                 (double)in_stack_ffffffffffffd458,
                 (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffd448,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6fb5b6);
      in_stack_ffffffffffffd464 = in_stack_ffffffffffffd464 & 0xffffff;
      if (tVar3) {
        local_160 = local_28a8;
        local_168 = &local_758;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_169,local_168);
        local_150 = local_28a8;
        local_158 = local_168;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffd448);
        local_148 = local_28a8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffd448,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x6fb664);
        in_stack_ffffffffffffd464 = CONCAT13(tVar3,(int3)in_stack_ffffffffffffd464);
      }
      if ((char)(in_stack_ffffffffffffd464 >> 0x18) == '\0') {
        local_450 = infinity();
        local_448 = local_29b0;
        local_458 = 0;
        local_2a0 = local_450;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                   (double)in_stack_ffffffffffffd458,
                   (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffd448,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x6fb7ac);
        in_stack_ffffffffffffd454 = in_stack_ffffffffffffd454 & 0xffffff;
        if (tVar3) {
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffd448,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x6fb7d0);
          in_stack_ffffffffffffd454 = CONCAT13(tVar3,(int3)in_stack_ffffffffffffd454);
        }
        if ((char)(in_stack_ffffffffffffd454 >> 0x18) != '\0') {
          in_stack_ffffffffffffd448 = local_6d8;
          in_stack_ffffffffffffd450 = local_147c;
          local_438 = infinity();
          local_430 = local_2a30;
          local_440 = 0;
          local_2a8 = local_438;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                     (double)in_stack_ffffffffffffd458,
                     (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
          (*(((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&(in_stack_ffffffffffffd448->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SPxSimplifier)->
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            )._vptr_ClassArray[0x24])
                    (in_stack_ffffffffffffd448,(ulong)in_stack_ffffffffffffd450,local_2a30,0);
          local_9fc = local_9fc + 1;
        }
      }
      else {
        in_stack_ffffffffffffd458 = local_6d8;
        in_stack_ffffffffffffd460 = local_147c;
        puVar7 = (ulong *)infinity();
        local_2930 = *puVar7 ^ 0x8000000000000000;
        local_460 = local_2928;
        local_468 = &local_2930;
        local_470 = 0;
        local_298 = local_468;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                   (double)in_stack_ffffffffffffd458,
                   (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
        (*(((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)&(in_stack_ffffffffffffd458->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SPxSimplifier)->
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          )._vptr_ClassArray[0x24])
                  (in_stack_ffffffffffffd458,(ulong)in_stack_ffffffffffffd460,local_2928,0);
        local_9fc = local_9fc + 1;
      }
    }
    else {
      local_27a0 = 0;
      local_490 = local_2798;
      local_498 = &local_27a0;
      local_4a0 = 0;
      in_stack_ffffffffffffd468 = local_6d8;
      local_288 = local_498;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffd464,in_stack_ffffffffffffd460),
                 (double)in_stack_ffffffffffffd458,
                 (type *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450));
      (*(((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)&(in_stack_ffffffffffffd468->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._vptr_SPxSimplifier)->
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        )._vptr_ClassArray[0x24])(in_stack_ffffffffffffd468,(ulong)uVar9,local_2798,0);
      local_9fc = local_9fc + 1;
    }
  }
  if (0 < local_9ec + local_9f0 + local_9f8 + local_9f4 + local_9fc) {
    (in_RDI->
    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).m_remRows = local_9ec +
                  (in_RDI->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_remRows;
    (in_RDI->
    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).m_remNzos = local_9f0 +
                  (in_RDI->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_remNzos;
    (in_RDI->
    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).m_chgLRhs = local_9f8 +
                  (in_RDI->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_chgLRhs;
    (in_RDI->
    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).m_chgBnds = local_9f4 +
                  (in_RDI->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_chgBnds;
    if (((in_RDI->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).spxout != (SPxOut *)0x0) &&
       (VVar6 = SPxOut::getVerbosity
                          ((in_RDI->
                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).spxout), 3 < (int)VVar6)) {
      local_2a34 = SPxOut::getVerbosity
                             ((in_RDI->
                              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).spxout);
      pSVar1 = (in_RDI->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      local_2a38 = 4;
      (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_2a38);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                         (char *)in_stack_ffffffffffffd448);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                         (int)((ulong)in_stack_ffffffffffffd448 >> 0x20));
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                         (char *)in_stack_ffffffffffffd448);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                         (int)((ulong)in_stack_ffffffffffffd448 >> 0x20));
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                         (char *)in_stack_ffffffffffffd448);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                         (int)((ulong)in_stack_ffffffffffffd448 >> 0x20));
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                         (char *)in_stack_ffffffffffffd448);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                         (int)((ulong)in_stack_ffffffffffffd448 >> 0x20));
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                         (char *)in_stack_ffffffffffffd448);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                         (int)((ulong)in_stack_ffffffffffffd448 >> 0x20));
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                         (char *)in_stack_ffffffffffffd448);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffd454,in_stack_ffffffffffffd450),
                         (_func_ostream_ptr_ostream_ptr *)in_stack_ffffffffffffd448);
      pSVar1 = (in_RDI->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_2a34);
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::handleExtremes(SPxLPBase<R>& lp)
{

   // This method handles extreme value of the given LP by
   //
   // 1. setting numbers of very small absolute values to zero and
   // 2. setting numbers of very large absolute values to R(-infinity) or +R(infinity), respectively.

   R maxVal  = R(infinity) / 5.0;
   R tol = feastol() * 1e-2;
   tol = (tol < this->epsZero()) ? this->epsZero() : tol;
   int  remRows = 0;
   int  remNzos = 0;
   int  chgBnds = 0;
   int  chgLRhs = 0;
   int  objCnt  = 0;

   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      // lhs
      R lhs = lp.lhs(i);

      if(lhs != 0.0 && isZero(lhs, this->epsZero()))
      {
         lp.changeLhs(i, R(0.0));
         ++chgLRhs;
      }
      else if(lhs > R(-infinity) && lhs < -maxVal)
      {
         lp.changeLhs(i, R(-infinity));
         ++chgLRhs;
      }
      else if(lhs <  R(infinity) && lhs >  maxVal)
      {
         lp.changeLhs(i,  R(infinity));
         ++chgLRhs;
      }

      // rhs
      R rhs = lp.rhs(i);

      if(rhs != 0.0 && isZero(rhs, this->epsZero()))
      {
         lp.changeRhs(i, R(0.0));
         ++chgLRhs;
      }
      else if(rhs > R(-infinity) && rhs < -maxVal)
      {
         lp.changeRhs(i, R(-infinity));
         ++chgLRhs;
      }
      else if(rhs <  R(infinity) && rhs >  maxVal)
      {
         lp.changeRhs(i,  R(infinity));
         ++chgLRhs;
      }

      if(lp.lhs(i) <= R(-infinity) && lp.rhs(i) >= R(infinity))
      {
         std::shared_ptr<PostStep> ptr(new FreeConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         removeRow(lp, i);
         ++remRows;

         ++m_stat[FREE_ROW];
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      // lower bound
      R lo = lp.lower(j);

      if(lo != 0.0 && isZero(lo, this->epsZero()))
      {
         lp.changeLower(j, R(0.0));
         ++chgBnds;
      }
      else if(lo > R(-infinity) && lo < -maxVal)
      {
         lp.changeLower(j, R(-infinity));
         ++chgBnds;
      }
      else if(lo <  R(infinity) && lo >  maxVal)
      {
         lp.changeLower(j,  R(infinity));
         ++chgBnds;
      }

      // upper bound
      R up = lp.upper(j);

      if(up != 0.0 && isZero(up, this->epsZero()))
      {
         lp.changeUpper(j, R(0.0));
         ++chgBnds;
      }
      else if(up > R(-infinity) && up < -maxVal)
      {
         lp.changeUpper(j, R(-infinity));
         ++chgBnds;
      }
      else if(up <  R(infinity) && up >  maxVal)
      {
         lp.changeUpper(j,  R(infinity));
         ++chgBnds;
      }

      // fixed columns will be eliminated later
      if(NE(lo, up, this->tolerances()->epsilon()))
      {
         lo = spxAbs(lo);
         up = spxAbs(up);

         R absBnd = (lo > up) ? lo : up;

         if(absBnd < 1.0)
            absBnd = 1.0;

         // non-zeros
         SVectorBase<R>& col = lp.colVector_w(j);
         int        i = 0;

         while(i < col.size())
         {
            R aij = spxAbs(col.value(i));

            if(isZero(aij * absBnd, tol))
            {
               SVectorBase<R>& row = lp.rowVector_w(col.index(i));
               int row_j = row.pos(j);

               // this changes col.size()
               if(row_j >= 0)
                  row.remove(row_j);

               col.remove(i);

               SPxOut::debug(this, "IMAISM04 aij={}  removed, absBnd={} \n", aij, absBnd);
               ++remNzos;
            }
            else
            {
               if(aij > maxVal)
               {
                  SPX_MSG_WARNING((*this->spxout),
                                  (*this->spxout) << "WMAISM05 Warning! Big matrix coefficient " << aij
                                  << std::endl);
               }
               else if(isZero(aij, tol))
               {
                  SPX_MSG_WARNING((*this->spxout),
                                  (*this->spxout) << "WMAISM06 Warning! Tiny matrix coefficient " << aij
                                  << std::endl);
               }

               ++i;
            }
         }
      }

      // objective
      R obj = lp.obj(j);

      if(obj != 0.0 && isZero(obj, this->epsZero()))
      {
         lp.changeObj(j, R(0.0));
         ++objCnt;
      }
      else if(obj > R(-infinity) && obj < -maxVal)
      {
         lp.changeObj(j, R(-infinity));
         ++objCnt;
      }
      else if(obj <  R(infinity) && obj >  maxVal)
      {
         lp.changeObj(j,  R(infinity));
         ++objCnt;
      }
   }

   if(remRows + remNzos + chgLRhs + chgBnds + objCnt > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;
      this->m_chgLRhs += chgLRhs;
      this->m_chgBnds += chgBnds;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (extremes) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros, "
                    << chgBnds << " col bounds, "
                    << chgLRhs << " row bounds, "
                    << objCnt  << " objective coefficients" << std::endl;)
   }

   assert(lp.isConsistent());
}